

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtCompareRev(word *pIn1,word *pIn2,int nWords)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)nWords;
  do {
    if ((int)uVar3 < 1) {
      return 0;
    }
    lVar1 = uVar3 - 1;
    lVar2 = uVar3 - 1;
    uVar3 = uVar3 - 1;
  } while (pIn1[lVar1] == pIn2[lVar2]);
  return -(uint)(pIn1[lVar1] < pIn2[lVar2]) | 1;
}

Assistant:

static inline int Abc_TtCompareRev( word * pIn1, word * pIn2, int nWords )
{
    int w;
    for ( w = nWords - 1; w >= 0; w-- )
        if ( pIn1[w] != pIn2[w] )
            return (pIn1[w] < pIn2[w]) ? -1 : 1;
    return 0;
}